

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_maximum_likelihood_parameter_generation.cc
# Opt level: O1

void __thiscall
sptk::RecursiveMaximumLikelihoodParameterGeneration::Forward
          (RecursiveMaximumLikelihoodParameterGeneration *this)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_01;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_02;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_03;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  pointer pdVar8;
  pointer pvVar9;
  pointer pvVar10;
  pointer pvVar11;
  pointer pvVar12;
  pointer pvVar13;
  long lVar14;
  bool bVar15;
  int iVar16;
  ulong uVar17;
  pointer pvVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  pointer pvVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  size_type __new_size;
  size_type sVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  bool bVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  double dVar46;
  ulong local_118;
  
  uVar20 = (int)((long)(this->window_coefficients_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->window_coefficients_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  iVar2 = this->num_order_;
  uVar19 = (long)iVar2 + 1;
  iVar39 = (int)uVar19;
  iVar24 = iVar39 * uVar20;
  this_00 = &(this->buffer_).stored_dynamic_mean_vectors;
  __new_size = (size_type)iVar24;
  if ((((long)(this->buffer_).stored_dynamic_mean_vectors.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).stored_dynamic_mean_vectors.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size !=
       0) && (std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::resize(this_00,__new_size), 0 < iVar24)) {
    lVar42 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).stored_dynamic_mean_vectors.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar42),(long)this->calculation_field_);
      lVar42 = lVar42 + 0x18;
    } while (__new_size * 0x18 != lVar42);
  }
  this_01 = &(this->buffer_).stored_dynamic_diagonal_covariance_matrices;
  if ((((long)(this->buffer_).stored_dynamic_diagonal_covariance_matrices.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).stored_dynamic_diagonal_covariance_matrices.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - __new_size !=
       0) && (std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::resize(this_01,__new_size), 0 < iVar24)) {
    lVar42 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).stored_dynamic_diagonal_covariance_matrices.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar42),(long)this->calculation_field_);
      lVar42 = lVar42 + 0x18;
    } while (__new_size * 0x18 != lVar42);
  }
  if ((((long)(this->buffer_).pi.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).pi.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar19 != 0)
     && (std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::resize(&(this->buffer_).pi,uVar19), -1 < iVar2)) {
    lVar42 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).pi.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar42),(long)this->calculation_field_);
      lVar42 = lVar42 + 0x18;
    } while ((uVar19 & 0xffffffff) * 0x18 != lVar42);
  }
  if ((((long)(this->buffer_).k.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).k.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar19 != 0)
     && (std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::resize(&(this->buffer_).k,uVar19), -1 < iVar2)) {
    lVar42 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).k.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar42),(long)this->calculation_field_);
      lVar42 = lVar42 + 0x18;
    } while ((uVar19 & 0xffffffff) * 0x18 != lVar42);
  }
  this_02 = &(this->buffer_).p;
  if ((((long)(this->buffer_).p.
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).p.
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar19 != 0)
     && (std::
         vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         ::resize(this_02,uVar19), -1 < iVar2)) {
    uVar37 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this->buffer_).p.
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar37,(long)this->calculation_field_);
      uVar17 = (ulong)(uint)this->calculation_field_;
      if (0 < this->calculation_field_) {
        lVar43 = 0;
        lVar42 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)
                     (*(long *)&(this_02->
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar37].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar43),
                     (long)((int)uVar17 * 2 + 1));
          lVar38 = *(long *)&(this_02->
                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar37].
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          pvVar6 = *(void **)(lVar38 + lVar43);
          pvVar7 = *(void **)(lVar38 + 8 + lVar43);
          if (pvVar6 != pvVar7) {
            memset(pvVar6,0,((long)pvVar7 + (-8 - (long)pvVar6) & 0xfffffffffffffff8U) + 8);
          }
          uVar17 = (ulong)this->calculation_field_;
          *(undefined8 *)((long)pvVar6 + uVar17 * 8) = 0x7fefffffffffffff;
          lVar42 = lVar42 + 1;
          lVar43 = lVar43 + 0x18;
        } while (lVar42 < (long)uVar17);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != (uVar19 & 0xffffffff));
  }
  this_03 = &(this->buffer_).c;
  if ((((long)(this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar19 != 0)
     && (std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::resize(this_03,uVar19), -1 < iVar2)) {
    lVar42 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((this->buffer_).c.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar42),(long)this->calculation_field_);
      pvVar18 = (this->buffer_).c.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = *(void **)((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar42);
      pvVar7 = *(void **)((long)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar42 + 8);
      if (pvVar6 != pvVar7) {
        memset(pvVar6,0,((long)pvVar7 + (-8 - (long)pvVar6) & 0xfffffffffffffff8U) + 8);
      }
      lVar42 = lVar42 + 0x18;
    } while ((uVar19 & 0xffffffff) * 0x18 != lVar42);
  }
  iVar3 = this->calculation_field_;
  iVar4 = this->current_frame_;
  uVar5 = this->num_past_frame_;
  iVar25 = ~uVar5 + iVar3;
  pdVar8 = (this->buffer_).static_and_dynamic_parameters.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar42 = (long)((iVar4 + iVar25) % iVar3);
  if (-1 < iVar2) {
    pvVar18 = (this_03->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar37 = 0;
    do {
      *(double *)
       (*(long *)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + lVar42 * 8) = pdVar8[uVar37];
      uVar37 = uVar37 + 1;
      pvVar18 = pvVar18 + 1;
    } while ((uVar19 & 0xffffffff) != uVar37);
  }
  lVar43 = (long)iVar39;
  if (0 < iVar24) {
    pvVar18 = (this_00->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    sVar26 = 0;
    do {
      *(double *)
       (*(long *)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + lVar42 * 8) = pdVar8[lVar43 + sVar26];
      sVar26 = sVar26 + 1;
      pvVar18 = pvVar18 + 1;
    } while (__new_size != sVar26);
  }
  lVar38 = (long)iVar3;
  if (-1 < iVar2) {
    pvVar22 = (this_02->
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar44 = 0;
    do {
      lVar31 = *(long *)((long)&(pvVar22->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data + lVar44);
      pvVar6 = *(void **)(lVar31 + lVar42 * 0x18);
      pvVar7 = *(void **)(lVar31 + 8 + lVar42 * 0x18);
      if (pvVar6 != pvVar7) {
        memset(pvVar6,0,((long)pvVar7 + (-8 - (long)pvVar6) & 0xfffffffffffffff8U) + 8);
      }
      lVar44 = lVar44 + 0x18;
    } while ((uVar19 & 0xffffffff) * 0x18 != lVar44);
  }
  if (-1 < iVar2) {
    pvVar22 = (this_02->
              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar37 = 0;
    do {
      *(double *)
       (*(long *)(*(long *)&(pvVar22->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data + lVar42 * 0x18) + lVar38 * 8) =
           pdVar8[(long)(iVar24 + iVar39) + uVar37];
      uVar37 = uVar37 + 1;
      pvVar22 = pvVar22 + 1;
    } while ((uVar19 & 0xffffffff) != uVar37);
  }
  if (0 < iVar24) {
    pvVar18 = (this_01->
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    sVar26 = 0;
    do {
      *(double *)
       (*(long *)&(pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data + lVar42 * 8) =
           pdVar8[(long)(iVar24 + iVar39) + lVar43 + sVar26];
      sVar26 = sVar26 + 1;
      pvVar18 = pvVar18 + 1;
    } while (__new_size != sVar26);
  }
  if (0 < (int)uVar20) {
    pvVar18 = (this->window_coefficients_).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar9 = (this->buffer_).stored_dynamic_mean_vectors.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar10 = (this->buffer_).pi.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar24 = -uVar5;
    pvVar11 = (this->buffer_).stored_dynamic_diagonal_covariance_matrices.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar12 = (this->buffer_).k.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar13 = (this->buffer_).c.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar44 = (long)iVar24;
    uVar19 = uVar19 & 0xffffffff;
    lVar42 = lVar44 * 8 + (long)(int)uVar5 * 8;
    lVar31 = (long)(int)uVar5 * 8;
    uVar37 = 0;
    do {
      lVar14 = *(long *)&pvVar18[uVar37].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data;
      iVar39 = (int)((ulong)((long)*(pointer *)
                                    ((long)&pvVar18[uVar37].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data + 8) - lVar14) >> 3);
      iVar41 = (iVar39 - (iVar39 + -1 >> 0x1f)) + -1 >> 1;
      if (iVar2 < 0) {
LAB_00109981:
        if (-1 < iVar2) {
          iVar16 = -iVar41;
          if (iVar41 != iVar16 && SBORROW4(iVar41,iVar16) == iVar41 * 2 < 0) {
            iVar16 = iVar41;
          }
          uVar17 = 0;
          do {
            if (iVar24 <= iVar25) {
              lVar27 = *(long *)&pvVar10[uVar17].super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data;
              pvVar22 = (this_02->
                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              lVar40 = lVar44;
              lVar45 = lVar38 + lVar44 + (long)iVar41;
              do {
                if (iVar39 < 0) {
                  dVar46 = 0.0;
                }
                else {
                  dVar46 = 0.0;
                  lVar23 = 0;
                  lVar30 = lVar45;
                  do {
                    dVar46 = dVar46 + *(double *)(lVar14 + lVar23 * 8) *
                                      *(double *)
                                       (*(long *)(*(long *)&pvVar22[uVar17].
                                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                 (long)(((iVar4 - iVar41) + (int)lVar23) % iVar3) *
                                                 0x18) + lVar30 * 8);
                    lVar23 = lVar23 + 1;
                    lVar30 = lVar30 + -1;
                  } while (iVar41 + iVar16 + 1 != (int)lVar23);
                }
                *(double *)(lVar27 + lVar31 + lVar40 * 8) = dVar46;
                lVar40 = lVar40 + 1;
                lVar45 = lVar45 + 1;
              } while (iVar3 - uVar5 != (int)lVar40);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar19);
        }
        if (-1 < iVar2) {
          iVar16 = -iVar41;
          if (iVar41 != iVar16 && SBORROW4(iVar41,iVar16) == iVar41 * 2 < 0) {
            iVar16 = iVar41;
          }
          uVar17 = 0;
          do {
            lVar27 = *(long *)&pvVar10[uVar17].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            if (iVar39 < 0) {
              dVar46 = 0.0;
            }
            else {
              dVar46 = 0.0;
              lVar40 = 0;
              do {
                dVar46 = dVar46 + *(double *)(lVar14 + lVar40 * 8) *
                                  *(double *)(lVar31 + lVar27 + (long)iVar41 * -8 + lVar40 * 8);
                lVar40 = lVar40 + 1;
              } while (iVar41 + iVar16 + 1 != (int)lVar40);
            }
            if ((int)-uVar5 <= iVar25) {
              dVar1 = *(double *)
                       (*(long *)&pvVar11[uVar37 * lVar43 + uVar17].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + (long)(iVar4 % iVar3) * 8);
              lVar40 = *(long *)&pvVar12[uVar17].super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar45 = 0;
              do {
                *(double *)(lVar40 + lVar42 + lVar45 * 8) =
                     *(double *)(lVar27 + lVar42 + lVar45 * 8) * (1.0 / (dVar46 + dVar1));
                lVar45 = lVar45 + 1;
              } while (iVar3 != (int)lVar45);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar19);
        }
        if (-1 < iVar2) {
          pvVar22 = (this_02->
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          iVar16 = -iVar41;
          local_118 = 0;
          do {
            if (iVar24 <= iVar25) {
              lVar27 = *(long *)&pvVar10[local_118].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              lVar40 = *(long *)&pvVar12[local_118].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              lVar45 = *(long *)&pvVar22[local_118].
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar30 = lVar44;
              lVar23 = lVar38 + lVar44;
              lVar34 = -lVar44;
              lVar35 = lVar38 * 8 + lVar44 * -8;
              do {
                lVar32 = (long)iVar16;
                if (iVar16 < lVar30) {
                  lVar32 = lVar30;
                }
                iVar21 = (int)lVar30;
                iVar29 = iVar16;
                if (iVar21 != iVar16 && SBORROW4(iVar21,iVar16) == iVar21 + iVar41 < 0) {
                  iVar29 = iVar21;
                }
                if (iVar29 <= iVar25) {
                  lVar28 = lVar23 - lVar32;
                  lVar32 = lVar32 + -1;
                  lVar33 = *(long *)(lVar45 + (long)((iVar4 + iVar21) % iVar3) * 0x18) + lVar35;
                  do {
                    dVar46 = *(double *)(lVar33 + 8 + lVar32 * 8) -
                             *(double *)(lVar40 + lVar31 + 8 + lVar32 * 8) *
                             *(double *)(lVar27 + lVar31 + lVar30 * 8);
                    *(double *)(lVar33 + 8 + lVar32 * 8) = dVar46;
                    if (lVar34 + lVar32 != -1) {
                      *(double *)
                       (*(long *)(lVar45 + (long)((iVar4 + (int)lVar32 + 1) % iVar3) * 0x18) +
                       lVar28 * 8) = dVar46;
                    }
                    lVar32 = lVar32 + 1;
                    lVar28 = lVar28 + -1;
                  } while (lVar32 < iVar25);
                }
                lVar30 = lVar30 + 1;
                lVar34 = lVar34 + -1;
                lVar35 = lVar35 + -8;
                lVar23 = lVar23 + 1;
              } while (iVar3 - uVar5 != (int)lVar30);
            }
            local_118 = local_118 + 1;
          } while (local_118 != uVar19);
        }
        if (-1 < iVar2) {
          iVar16 = -iVar41;
          if (iVar41 != iVar16 && SBORROW4(iVar41,iVar16) == iVar41 * 2 < 0) {
            iVar16 = iVar41;
          }
          uVar17 = 0;
          do {
            lVar27 = *(long *)&pvVar13[uVar17].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data;
            dVar46 = *(double *)
                      (*(long *)&pvVar9[uVar37 * lVar43 + uVar17].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + (long)(iVar4 % iVar3) * 8);
            if (-1 < iVar39) {
              lVar40 = 0;
              do {
                dVar46 = dVar46 - *(double *)(lVar14 + lVar40 * 8) *
                                  *(double *)
                                   (lVar27 + (long)(((iVar4 - iVar41) + (int)lVar40) % iVar3) * 8);
                lVar40 = lVar40 + 1;
              } while (iVar41 + iVar16 + 1 != (int)lVar40);
            }
            if ((int)-uVar5 <= iVar25) {
              lVar40 = *(long *)&pvVar12[uVar17].super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar45 = 0;
              do {
                lVar30 = (long)((int)((int)lVar45 + (iVar4 - uVar5)) % iVar3);
                *(double *)(lVar27 + lVar30 * 8) =
                     *(double *)(lVar40 + lVar42 + lVar45 * 8) * dVar46 +
                     *(double *)(lVar27 + lVar30 * 8);
                lVar45 = lVar45 + 1;
              } while (iVar3 != (int)lVar45);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar19);
        }
      }
      else {
        iVar16 = -iVar41;
        if (iVar41 != iVar16 && SBORROW4(iVar41,iVar16) == iVar41 * 2 < 0) {
          iVar16 = iVar41;
        }
        bVar36 = true;
        lVar27 = 0;
        do {
          if (-1 < iVar39) {
            iVar29 = iVar41 + iVar16 + 1;
            iVar21 = iVar4 - iVar41;
            do {
              dVar46 = *(double *)
                        (*(long *)(*(long *)&(this_02->
                                             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[lVar27].
                                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                             ._M_impl.super__Vector_impl_data +
                                  (long)(iVar21 % iVar3) * 0x18) + lVar38 * 8);
              if ((dVar46 == 1.79769313486232e+308) && (!NAN(dVar46))) {
                bVar36 = false;
                break;
              }
              iVar21 = iVar21 + 1;
              iVar29 = iVar29 + -1;
            } while (iVar29 != 0);
          }
        } while ((bVar36) && (bVar15 = lVar27 < iVar2, lVar27 = lVar27 + 1, bVar15));
        if (bVar36) goto LAB_00109981;
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != (uVar20 & 0x7fffffff));
  }
  this->current_frame_ = iVar4 + 1;
  return;
}

Assistant:

void RecursiveMaximumLikelihoodParameterGeneration::Forward() {
  const int num_delta(static_cast<int>(window_coefficients_.size()));
  const int static_size(num_order_ + 1);
  const int dynamic_size(static_size * num_delta);

  // Prepare memories.
  {
    if (buffer_.stored_dynamic_mean_vectors.size() !=
        static_cast<std::size_t>(dynamic_size)) {
      buffer_.stored_dynamic_mean_vectors.resize(dynamic_size);
      for (int m(0); m < dynamic_size; ++m) {
        buffer_.stored_dynamic_mean_vectors[m].resize(calculation_field_);
      }
    }

    if (buffer_.stored_dynamic_diagonal_covariance_matrices.size() !=
        static_cast<std::size_t>(dynamic_size)) {
      buffer_.stored_dynamic_diagonal_covariance_matrices.resize(dynamic_size);
      for (int m(0); m < dynamic_size; ++m) {
        buffer_.stored_dynamic_diagonal_covariance_matrices[m].resize(
            calculation_field_);
      }
    }

    if (buffer_.pi.size() != static_cast<std::size_t>(static_size)) {
      buffer_.pi.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.pi[m].resize(calculation_field_);
      }
    }

    if (buffer_.k.size() != static_cast<std::size_t>(static_size)) {
      buffer_.k.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.k[m].resize(calculation_field_);
      }
    }

    if (buffer_.p.size() != static_cast<std::size_t>(static_size)) {
      buffer_.p.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.p[m].resize(calculation_field_);
        for (int u(0); u < calculation_field_; ++u) {
          buffer_.p[m][u].resize(2 * calculation_field_ + 1);
          std::fill(buffer_.p[m][u].begin(), buffer_.p[m][u].end(), 0.0);
          buffer_.p[m][u][calculation_field_] = kInf;
        }
      }
    }

    if (buffer_.c.size() != static_cast<std::size_t>(static_size)) {
      buffer_.c.resize(static_size);
      for (int m(0); m < static_size; ++m) {
        buffer_.c[m].resize(calculation_field_);
        std::fill(buffer_.c[m].begin(), buffer_.c[m].end(), 0.0);
      }
    }
  }

  // Copy inputs.
  const int max_half_window_width(calculation_field_ - num_past_frame_ - 1);
  {
    const int t((current_frame_ + max_half_window_width) % calculation_field_);

    const double* static_and_dynamic_mean_vector(
        &(buffer_.static_and_dynamic_parameters[0]));
    for (int m(0); m < static_size; ++m) {
      buffer_.c[m][t] = static_and_dynamic_mean_vector[m];
    }
    for (int m(0); m < dynamic_size; ++m) {
      buffer_.stored_dynamic_mean_vectors[m][t] =
          static_and_dynamic_mean_vector[static_size + m];
    }

    const double* static_and_dynamic_diagonal_covariance_matrix(
        &(buffer_.static_and_dynamic_parameters[static_size + dynamic_size]));
    for (int m(0); m < static_size; ++m) {
      std::fill(buffer_.p[m][t].begin(), buffer_.p[m][t].end(), 0.0);
    }
    for (int m(0); m < static_size; ++m) {
      buffer_.p[m][t][calculation_field_] =
          static_and_dynamic_diagonal_covariance_matrix[m];
    }
    for (int m(0); m < dynamic_size; ++m) {
      buffer_.stored_dynamic_diagonal_covariance_matrices[m][t] =
          static_and_dynamic_diagonal_covariance_matrix[static_size + m];
    }
  }

  for (int d(0); d < num_delta; ++d) {
    const int half_window_width(
        (static_cast<int>(window_coefficients_[d].size()) - 1) / 2);
    const double* window_coefficients(
        &(window_coefficients_[d][half_window_width]));

    // Do not update state if given variance is infinite.
    bool update(true);
    for (int m(0); m < static_size; ++m) {
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        if (kInf == buffer_.p[m][(current_frame_ + j) % calculation_field_]
                             [calculation_field_]) {
          update = false;
          break;
        }
      }
      if (!update) break;
    }
    if (!update) continue;

    // Calculate the numerator of Kalman gain.
    for (int m(0); m < static_size; ++m) {
      double* pi(&buffer_.pi[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        double tmp(0.0);
        for (int j(-half_window_width); j <= half_window_width; ++j) {
          const double* p(
              &buffer_.p[m][(current_frame_ + j) % calculation_field_]
                        [calculation_field_]);
          tmp += window_coefficients[j] * p[u - j];
        }
        pi[u] = tmp;
      }
    }

    // Calculate Kalman gain.
    for (int m(0); m < static_size; ++m) {
      const double* pi(&buffer_.pi[m][num_past_frame_]);
      double tmp(0.0);
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        tmp += window_coefficients[j] * pi[j];
      }

      const double denominator(
          1.0 /
          (tmp +
           buffer_.stored_dynamic_diagonal_covariance_matrices
               [static_size * d + m][current_frame_ % calculation_field_]));
      double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        k[u] = pi[u] * denominator;
      }
    }

    // Update error covariance.
    for (int m(0); m < static_size; ++m) {
      const double* pi(&buffer_.pi[m][num_past_frame_]);
      const double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        double* pu(&buffer_.p[m][(current_frame_ + u) % calculation_field_]
                             [calculation_field_]);
        for (int v(std::max(u, -half_window_width)); v <= max_half_window_width;
             ++v) {
          pu[v - u] -= k[v] * pi[u];
          if (v != u) {
            double* pv(&buffer_.p[m][(current_frame_ + v) % calculation_field_]
                                 [calculation_field_]);
            pv[u - v] = pu[v - u];
          }
        }
      }
    }

    // Update state estimates.
    for (int m(0); m < static_size; ++m) {
      double* c(&buffer_.c[m][0]);
      double tmp(buffer_.stored_dynamic_mean_vectors[static_size * d + m]
                                                    [current_frame_ %
                                                     calculation_field_]);
      for (int j(-half_window_width); j <= half_window_width; ++j) {
        tmp -= window_coefficients[j] *
               c[(current_frame_ + j) % calculation_field_];
      }

      const double* k(&buffer_.k[m][num_past_frame_]);
      for (int u(-num_past_frame_); u <= max_half_window_width; ++u) {
        c[(current_frame_ + u) % calculation_field_] += k[u] * tmp;
      }
    }
  }

  ++current_frame_;
}